

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O2

ion_status_t flat_file_update(ion_flat_file_t *flat_file,ion_key_t key,ion_value_t value)

{
  byte bVar1;
  char cVar2;
  ion_status_t iVar3;
  uint uVar4;
  ion_status_t iVar5;
  ion_fpos_t iVar6;
  ulong uVar7;
  ion_fpos_t loc;
  ion_flat_file_row_t local_60;
  ion_flat_file_row_t row;
  
  loc = -1;
  if (flat_file->sorted_mode == '\0') {
    iVar6 = -1;
LAB_001072f1:
    uVar4 = 0;
    uVar7 = 0;
    while( true ) {
      iVar3.error = flat_file_scan(flat_file,iVar6,&loc,&row,'\x01',flat_file_predicate_key_match,
                                   key);
      iVar6 = loc;
      if (iVar3.error != 0) break;
      local_60.row_status = '\x01';
      local_60.key = key;
      local_60.value = value;
      iVar3.error = flat_file_write_row(flat_file,loc,&local_60);
      iVar3._1_7_ = 0;
      if (iVar3.error != 0) goto LAB_001073c3;
      uVar7 = (ulong)((int)uVar7 + 1);
      iVar6 = iVar6 + 1;
      loc = iVar6;
    }
    if ((int)uVar7 != 0 || iVar3.error != 0xe) {
      iVar5.error = '\0';
      iVar5._1_3_ = 0;
      iVar5.count = 0;
      uVar4 = 0;
      iVar3._1_7_ = 0;
      if (iVar3.error == 0xe) {
        iVar3 = iVar5;
      }
      goto LAB_001073c3;
    }
LAB_001073ab:
    iVar3 = flat_file_insert(flat_file,key,value);
    uVar7 = (ulong)iVar3 >> 0x20;
    uVar4 = iVar3._0_4_;
  }
  else {
    bVar1 = flat_file_binary_search(flat_file,key,&loc);
    iVar6 = loc;
    if (bVar1 == 0) {
      bVar1 = flat_file_read_row(flat_file,loc,&row);
      if (bVar1 == 0) {
        cVar2 = (*(flat_file->super).compare)(row.key,key,(flat_file->super).record.key_size);
        if (cVar2 == '\0') goto LAB_001072f1;
        goto LAB_001073ab;
      }
    }
    else if (bVar1 == 1) goto LAB_001073ab;
    iVar3._1_7_ = 0;
    iVar3.error = bVar1;
    uVar7 = 0;
    uVar4 = 0;
  }
LAB_001073c3:
  return (ion_status_t)((ulong)iVar3 & 0xff | (ulong)(uVar4 & 0xffffff00) | uVar7 << 0x20);
}

Assistant:

ion_status_t
flat_file_update(
	ion_flat_file_t *flat_file,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_status_t status		= ION_STATUS_INITIALIZE;

	ion_fpos_t			loc = -1;
	ion_flat_file_row_t row;
	ion_err_t			err;

	if (flat_file->sorted_mode) {
		err = flat_file_binary_search(flat_file, key, &loc);

		if (err_ok != err) {
			if (err_item_not_found == err) {
				/* Key didn't exist, do upsert. This may fail because it violates the sorted order. */
				return flat_file_insert(flat_file, key, value);
			}

			status.error = err;
			return status;
		}

		err = flat_file_read_row(flat_file, loc, &row);

		if (err_ok != err) {
			status.error = err;
			return status;
		}

		if (0 != flat_file->super.compare(row.key, key, flat_file->super.record.key_size)) {
			/* Key didn't exist, do upsert. */
			return flat_file_insert(flat_file, key, value);
		}
	}

	while (err_ok == (err = flat_file_scan(flat_file, loc, &loc, &row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_key_match, key))) {
		ion_err_t row_err = flat_file_write_row(flat_file, loc, &(ion_flat_file_row_t) { ION_FLAT_FILE_STATUS_OCCUPIED, key, value });

		if (err_ok != row_err) {
			status.error = row_err;
			return status;
		}

		status.count++;
		/* Move one-forwards to skip the one we just updated */
		loc++;
	}

	status.error = err_ok;

	if ((err == err_file_hit_eof) && (status.count == 0)) {
		/* If this is the case, then we had nothing to update. Do an upsert instead */
		return flat_file_insert(flat_file, key, value);
	}
	else if (err != err_file_hit_eof) {
		status.error = err;
	}

	return status;
}